

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FICastSound,_FICastSound>::Resize(TArray<FICastSound,_FICastSound> *this,uint amount)

{
  FICastSound *pFVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  uint amount_00;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  amount_00 = amount - this->Count;
  if (this->Count <= amount && amount_00 != 0) {
    Grow(this,amount_00);
    auVar4 = _DAT_005d6f70;
    auVar3 = _DAT_005d6240;
    auVar2 = _DAT_005d6230;
    uVar5 = (ulong)this->Count;
    if (this->Count < amount) {
      pFVar1 = this->Array;
      lVar7 = (amount - uVar5) + -1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_005d6240;
      do {
        auVar10._8_4_ = (int)uVar6;
        auVar10._0_8_ = uVar6;
        auVar10._12_4_ = (int)(uVar6 >> 0x20);
        auVar11 = (auVar10 | auVar2) ^ auVar3;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_
                    ) & 1)) {
          pFVar1[uVar5 + uVar6].mSound.ID = 0;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          pFVar1[uVar5 + uVar6 + 1].mSound.ID = 0;
        }
        auVar10 = (auVar10 | auVar4) ^ auVar3;
        iVar12 = auVar10._4_4_;
        if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
          pFVar1[uVar5 + uVar6 + 2].mSound.ID = 0;
          pFVar1[uVar5 + uVar6 + 3].mSound.ID = 0;
        }
        uVar6 = uVar6 + 4;
      } while (((amount - uVar5) + 3 & 0xfffffffffffffffc) != uVar6);
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}